

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_schema.c
# Opt level: O1

void tnt_schema_space_free(mh_assoc_t *schema)

{
  tnt_schema_sval *val;
  mh_int_t *pmVar1;
  char *key;
  uint32_t uVar2;
  int iVar3;
  uint uVar4;
  sbyte sVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint x;
  assoc_val *ptr;
  assoc_val *local_48;
  
  uVar4 = schema->n_buckets;
  if (uVar4 == 0) {
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
    do {
      if ((schema->b[uVar9 >> 4] >> ((uint)uVar9 & 0xf) & 1) != 0) goto LAB_0010704d;
      uVar8 = (uint)uVar9 + 1;
      uVar9 = (ulong)uVar8;
    } while (uVar4 != uVar8);
    uVar9 = (ulong)uVar4;
  }
LAB_0010704d:
  if ((uint)uVar9 < schema->n_buckets) {
    do {
      val = (tnt_schema_sval *)schema->p[uVar9]->data;
      uVar2 = PMurHash32(0xd,&val->number,4);
      uVar4 = schema->n_buckets;
      uVar7 = (ulong)uVar2 % (ulong)uVar4;
      pmVar1 = schema->b;
      while( true ) {
        uVar8 = (uint)uVar7;
        if (((((pmVar1[uVar7 >> 4] >> (uVar8 & 0xf) & 1) != 0) &&
             ((schema->p[uVar7]->key).id_len == 4)) &&
            (uVar6 = uVar8, val->number == *(uint32_t *)(schema->p[uVar7]->key).id)) ||
           (uVar6 = uVar4, ((pmVar1[uVar7 >> 4] >> (sbyte)(uVar8 & 0xf)) >> 0x10 & 1) == 0)) break;
        uVar8 = uVar8 + uVar2 % (uVar4 - 1) + 1;
        if (uVar8 < uVar4) {
          uVar6 = 0;
        }
        uVar7 = (ulong)(uVar8 - uVar6);
      }
      if (uVar6 == uVar4) {
        local_48 = (assoc_val *)0x0;
      }
      else {
        local_48 = schema->p[uVar6];
        uVar4 = uVar6 >> 4;
        sVar5 = (sbyte)(uVar6 & 0xf);
        if ((pmVar1[uVar4] >> (uVar6 & 0xf) & 1) != 0) {
          pmVar1[uVar4] = pmVar1[uVar4] & ~(1 << sVar5);
          schema->size = schema->size - 1;
          if (((pmVar1[uVar4] >> sVar5) >> 0x10 & 1) == 0) {
            schema->n_dirty = schema->n_dirty - 1;
          }
          if (schema->resize_position != 0) {
            mh_assoc_del_resize(schema,uVar6,(void *)0x0);
          }
        }
      }
      key = val->name;
      uVar4 = val->name_len;
      uVar2 = PMurHash32(0xd,key,uVar4);
      uVar8 = schema->n_buckets;
      uVar7 = (ulong)uVar2 % (ulong)uVar8;
      pmVar1 = schema->b;
      while( true ) {
        uVar10 = (uint)uVar7;
        uVar6 = pmVar1[uVar7 >> 4];
        if (((((uVar6 >> (uVar10 & 0xf) & 1) != 0) && (uVar4 == (schema->p[uVar7]->key).id_len)) &&
            (iVar3 = bcmp(key,(schema->p[uVar7]->key).id,(ulong)uVar4), x = uVar10, iVar3 == 0)) ||
           (x = uVar8, ((uVar6 >> (sbyte)(uVar10 & 0xf)) >> 0x10 & 1) == 0)) break;
        uVar10 = uVar10 + uVar2 % (uVar8 - 1) + 1;
        uVar6 = uVar8;
        if (uVar10 < uVar8) {
          uVar6 = 0;
        }
        uVar7 = (ulong)(uVar10 - uVar6);
      }
      if (x == uVar8) {
        ptr = (assoc_val *)0x0;
      }
      else {
        ptr = schema->p[x];
        uVar4 = x >> 4;
        sVar5 = (sbyte)(x & 0xf);
        if ((pmVar1[uVar4] >> (x & 0xf) & 1) != 0) {
          pmVar1[uVar4] = pmVar1[uVar4] & ~(1 << sVar5);
          schema->size = schema->size - 1;
          if (((pmVar1[uVar4] >> sVar5) >> 0x10 & 1) == 0) {
            schema->n_dirty = schema->n_dirty - 1;
          }
          if (schema->resize_position != 0) {
            mh_assoc_del_resize(schema,x,(void *)0x0);
          }
        }
      }
      tnt_schema_sval_free(val);
      if (local_48 != (assoc_val *)0x0) {
        tnt_mem_free(local_48);
      }
      if (ptr != (assoc_val *)0x0) {
        tnt_mem_free(ptr);
      }
      uVar4 = schema->n_buckets;
      uVar8 = (uint)uVar9;
      if (uVar8 < uVar4) {
        do {
          uVar8 = uVar8 + 1;
          if (uVar4 == uVar8) {
            uVar9 = (ulong)uVar4;
            break;
          }
          uVar9 = (ulong)uVar8;
        } while ((schema->b[uVar8 >> 4] >> (uVar8 & 0xf) & 1) == 0);
      }
    } while ((uint)uVar9 < schema->n_buckets);
  }
  return;
}

Assistant:

static inline void
tnt_schema_space_free(struct mh_assoc_t *schema) {
	mh_int_t pos = 0;
	mh_int_t space_slot = 0;
	mh_foreach(schema, pos) {
		struct tnt_schema_sval *sval = NULL;
		sval = (*mh_assoc_node(schema, pos))->data;
		struct assoc_val *av1 = NULL, *av2 = NULL;
		do {
			struct assoc_key key_number = {
				(void *)&(sval->number),
				sizeof(uint32_t)
			};
			space_slot = mh_assoc_find(schema, &key_number, NULL);
			if (space_slot == mh_end(schema))
				break;
			av1 = *mh_assoc_node(schema, space_slot);
			mh_assoc_del(schema, space_slot, NULL);
		} while (0);
		do {
			struct assoc_key key_string = {
				sval->name,
				sval->name_len
			};
			space_slot = mh_assoc_find(schema, &key_string, NULL);
			if (space_slot == mh_end(schema))
				break;
			av2 = *mh_assoc_node(schema, space_slot);
			mh_assoc_del(schema, space_slot, NULL);
		} while (0);
		tnt_schema_sval_free(sval);
		if (av1) tnt_mem_free((void *)av1);
		if (av2) tnt_mem_free((void *)av2);
	}
}